

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O2

void __thiscall World::create_gold(World *this,pair<int,_int> gold)

{
  reference this_00;
  reference this_01;
  
  this_00 = std::
            vector<std::vector<Room,_std::allocator<Room>_>,_std::allocator<std::vector<Room,_std::allocator<Room>_>_>_>
            ::at(&this->boxes,(long)gold.first);
  this_01 = std::vector<Room,_std::allocator<Room>_>::at(this_00,(long)gold >> 0x20);
  Room::set_glitter(this_01,true);
  return;
}

Assistant:

void World::create_gold(pair<int, int> gold)
{
    int pos[] = {gold.first, gold.second};
    int point = convert_to_1d(pos);
    //initialize glitter
    boxes.at(pos[0]).at(pos[1]).set_glitter(true);
    //cout << pos[0] << ", " << pos[1] << " glitter" << endl;
}